

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O3

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *extraout_RDX;
  undefined8 *puVar4;
  ulong uVar5;
  void *pvVar6;
  undefined8 *__dest;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 *__src;
  bool bVar9;
  uchar tmp [64];
  undefined8 local_78 [9];
  
  if (count < 2) {
    return;
  }
  uVar3 = count >> 1;
  __dest = (undefined8 *)count;
  __src = (undefined8 *)ptr;
  do {
    uVar3 = uVar3 - 1;
    uVar5 = uVar3;
    while (uVar5 < count >> 1) {
      uVar1 = uVar5 * 2 + 1;
      if (count <= uVar1) {
        secp256k1_hsort_cold_1();
        goto LAB_00122568;
      }
      uVar8 = uVar5 * 2 + 2;
      if (uVar8 < count) {
        puVar7 = (undefined8 *)(uVar8 * size + (long)ptr);
        iVar2 = (*cmp)(puVar7,(void *)((long)ptr + uVar1 * size),cmp_data);
        if (iVar2 < 0) goto LAB_00122302;
        puVar4 = (undefined8 *)(uVar5 * size + (long)ptr);
        __dest = puVar4;
        __src = puVar7;
        iVar2 = (*cmp)(puVar7,puVar4,cmp_data);
        if (iVar2 < 1) break;
        __dest = local_78;
        memcpy(__dest,puVar4,size);
        memmove(puVar4,puVar7,size);
        memcpy(puVar7,__dest,size);
        uVar5 = uVar8;
        __src = puVar7;
      }
      else {
LAB_00122302:
        puVar7 = (undefined8 *)(uVar1 * size + (long)ptr);
        puVar4 = (undefined8 *)(uVar5 * size + (long)ptr);
        __dest = puVar4;
        __src = puVar7;
        iVar2 = (*cmp)(puVar7,puVar4,cmp_data);
        if (iVar2 < 1) break;
        __dest = local_78;
        memcpy(__dest,puVar4,size);
        memmove(puVar4,puVar7,size);
        memcpy(puVar7,__dest,size);
        uVar5 = uVar1;
        __src = puVar7;
      }
    }
  } while (uVar3 != 0);
  __dest = local_78;
  memcpy(__dest,ptr,size);
  __src = (undefined8 *)((count - 1) * size + (long)ptr);
  memmove(ptr,__src,size);
  memcpy(__src,__dest,size);
  uVar3 = count - 1;
  if (count == 2) {
    return;
  }
  do {
    uVar5 = 0;
    do {
      uVar1 = uVar5 * 2 + 1;
      if (uVar3 <= uVar1) {
LAB_00122568:
        secp256k1_hsort_cold_2();
        secp256k1_pubkey_cmp
                  ((secp256k1_context *)*extraout_RDX,(secp256k1_pubkey *)*__src,
                   (secp256k1_pubkey *)*__dest);
        return;
      }
      uVar8 = uVar5 * 2 + 2;
      if (uVar8 < uVar3) {
        __src = (undefined8 *)(uVar8 * size + (long)ptr);
        iVar2 = (*cmp)(__src,(void *)((long)ptr + uVar1 * size),cmp_data);
        if (iVar2 < 0) goto LAB_0012249d;
        pvVar6 = (void *)(uVar5 * size + (long)ptr);
        iVar2 = (*cmp)(__src,pvVar6,cmp_data);
        if (iVar2 < 1) break;
        __dest = local_78;
        memcpy(__dest,pvVar6,size);
        memmove(pvVar6,__src,size);
        memcpy(__src,__dest,size);
        uVar5 = uVar8;
      }
      else {
LAB_0012249d:
        __src = (undefined8 *)(uVar1 * size + (long)ptr);
        pvVar6 = (void *)(uVar5 * size + (long)ptr);
        iVar2 = (*cmp)(__src,pvVar6,cmp_data);
        if (iVar2 < 1) break;
        __dest = local_78;
        memcpy(__dest,pvVar6,size);
        memmove(pvVar6,__src,size);
        memcpy(__src,__dest,size);
        uVar5 = uVar1;
      }
    } while (uVar5 < uVar3 >> 1);
    __dest = local_78;
    memcpy(__dest,ptr,size);
    __src = (undefined8 *)((uVar3 - 1) * size + (long)ptr);
    memmove(ptr,__src,size);
    memcpy(__src,__dest,size);
    bVar9 = uVar3 == 2;
    uVar3 = uVar3 - 1;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data ) {
    size_t i;

    for(i = count/2; 0 < i; --i) {
        heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for(i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}